

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Encode.cpp
# Opt level: O3

void idx2::Dealloc(encode_data *E)

{
  allocator *paVar1;
  long lVar2;
  long lVar3;
  channel *C;
  chunk_exp_info *Ce;
  long lVar4;
  chunk_meta_info *pcVar5;
  long lVar6;
  sub_channel *psVar7;
  
  lVar4 = -0x8000000000000000;
  (*E->Alloc->_vptr_allocator[2])();
  Dealloc<unsigned_long,idx2::brick_volume>(&E->BrickPool);
  lVar3 = (E->Channels).LogCapacity;
  lVar2 = 1L << ((byte)lVar3 & 0x3f);
  lVar6 = -0x8000000000000000;
  if (lVar3 == 0x3f) {
LAB_0018da39:
    if (lVar6 != lVar2) {
      C = (E->Channels).Vals + lVar6;
      do {
        Dealloc(C);
        lVar3 = lVar6 * -0xd8;
        do {
          lVar3 = lVar3 + -0xd8;
          lVar2 = lVar6 + 1;
          lVar6 = lVar6 + 1;
        } while ((E->Channels).Stats[lVar2] != Occupied);
        C = (channel *)((long)(E->Channels).Vals - lVar3);
      } while (1L << ((byte)(E->Channels).LogCapacity & 0x3f) != lVar6);
    }
  }
  else {
    lVar6 = 0;
    lVar3 = 0;
    if (0 < lVar2) {
      lVar3 = lVar2;
    }
    do {
      if ((E->Channels).Stats[lVar6] == Occupied) goto LAB_0018da39;
      lVar6 = lVar6 + 1;
    } while (lVar3 + 1 != lVar6);
  }
  Dealloc<unsigned_int,idx2::channel>(&E->Channels);
  lVar3 = (E->SubChannels).LogCapacity;
  lVar2 = 1L << ((byte)lVar3 & 0x3f);
  lVar6 = -0x8000000000000000;
  if (lVar3 == 0x3f) {
LAB_0018dad1:
    if (lVar6 != lVar2) {
      psVar7 = (E->SubChannels).Vals + lVar6;
      do {
        paVar1 = (psVar7->BlockExpStream).Stream.Alloc;
        (*paVar1->_vptr_allocator[1])(paVar1,psVar7);
        paVar1 = (psVar7->BrickExpStream).Stream.Alloc;
        (psVar7->BlockExpStream).BitPtr = (psVar7->BlockExpStream).Stream.Data;
        (psVar7->BlockExpStream).BitPos = 0;
        (psVar7->BlockExpStream).BitBuf = 0;
        (*paVar1->_vptr_allocator[1])(paVar1,&psVar7->BrickExpStream);
        (psVar7->BrickExpStream).BitPtr = (psVar7->BrickExpStream).Stream.Data;
        (psVar7->BrickExpStream).BitPos = 0;
        (psVar7->BrickExpStream).BitBuf = 0;
        lVar3 = lVar6 * -0x70;
        do {
          lVar3 = lVar3 + -0x70;
          lVar2 = lVar6 + 1;
          lVar6 = lVar6 + 1;
        } while ((E->SubChannels).Stats[lVar2] != Occupied);
        psVar7 = (sub_channel *)((long)(E->SubChannels).Vals - lVar3);
      } while (1L << ((byte)(E->SubChannels).LogCapacity & 0x3f) != lVar6);
    }
  }
  else {
    lVar6 = 0;
    lVar3 = 0;
    if (0 < lVar2) {
      lVar3 = lVar2;
    }
    do {
      if ((E->SubChannels).Stats[lVar6] == Occupied) goto LAB_0018dad1;
      lVar6 = lVar6 + 1;
    } while (lVar3 + 1 != lVar6);
  }
  Dealloc<unsigned_long,idx2::sub_channel>(&E->SubChannels);
  paVar1 = (E->SortedChannels).Alloc;
  (*paVar1->_vptr_allocator[1])(paVar1,&E->SortedChannels);
  (E->SortedChannels).Size = 0;
  (E->SortedChannels).Capacity = 0;
  paVar1 = (E->SortedSubChannels).Alloc;
  (*paVar1->_vptr_allocator[1])(paVar1,&E->SortedSubChannels);
  (E->SortedSubChannels).Size = 0;
  (E->SortedSubChannels).Capacity = 0;
  lVar3 = (E->ChunkMeta).LogCapacity;
  lVar2 = 1L << ((byte)lVar3 & 0x3f);
  lVar6 = -0x8000000000000000;
  if (lVar3 == 0x3f) {
LAB_0018dbdf:
    if (lVar6 != lVar2) {
      pcVar5 = (E->ChunkMeta).Vals + lVar6;
      do {
        paVar1 = (pcVar5->Addrs).Alloc;
        (*paVar1->_vptr_allocator[1])(paVar1,pcVar5);
        (pcVar5->Addrs).Size = 0;
        (pcVar5->Addrs).Capacity = 0;
        paVar1 = (pcVar5->Sizes).Stream.Alloc;
        (*paVar1->_vptr_allocator[1])(paVar1,&pcVar5->Sizes);
        (pcVar5->Sizes).BitPtr = (pcVar5->Sizes).Stream.Data;
        (pcVar5->Sizes).BitPos = 0;
        (pcVar5->Sizes).BitBuf = 0;
        lVar3 = lVar6 * -0x60;
        do {
          lVar3 = lVar3 + -0x60;
          lVar2 = lVar6 + 1;
          lVar6 = lVar6 + 1;
        } while ((E->ChunkMeta).Stats[lVar2] != Occupied);
        pcVar5 = (chunk_meta_info *)((long)(E->ChunkMeta).Vals - lVar3);
      } while (1L << ((byte)(E->ChunkMeta).LogCapacity & 0x3f) != lVar6);
    }
  }
  else {
    lVar6 = 0;
    lVar3 = 0;
    if (0 < lVar2) {
      lVar3 = lVar2;
    }
    do {
      if ((E->ChunkMeta).Stats[lVar6] == Occupied) goto LAB_0018dbdf;
      lVar6 = lVar6 + 1;
    } while (lVar3 + 1 != lVar6);
  }
  lVar6 = (E->ChunkExponents).LogCapacity;
  lVar3 = 1L << ((byte)lVar6 & 0x3f);
  if (lVar6 == 0x3f) {
LAB_0018dcb9:
    if (lVar4 != lVar3) {
      Ce = (E->ChunkExponents).Vals + lVar4;
      do {
        Dealloc(Ce);
        lVar6 = lVar4 * -0x90;
        do {
          lVar6 = lVar6 + -0x90;
          lVar3 = lVar4 + 1;
          lVar4 = lVar4 + 1;
        } while ((E->ChunkExponents).Stats[lVar3] != Occupied);
        Ce = (chunk_exp_info *)((long)(E->ChunkExponents).Vals - lVar6);
      } while (1L << ((byte)(E->ChunkExponents).LogCapacity & 0x3f) != lVar4);
    }
  }
  else {
    lVar4 = 0;
    lVar6 = 0;
    if (0 < lVar3) {
      lVar6 = lVar3;
    }
    do {
      if ((E->ChunkExponents).Stats[lVar4] == Occupied) goto LAB_0018dcb9;
      lVar4 = lVar4 + 1;
    } while (lVar6 + 1 != lVar4);
  }
  Dealloc<unsigned_long,idx2::chunk_meta_info>(&E->ChunkMeta);
  paVar1 = (E->CompressedChunkAddresses).Stream.Alloc;
  (*paVar1->_vptr_allocator[1])(paVar1,&E->CompressedChunkAddresses);
  paVar1 = (E->ChunkStream).Stream.Alloc;
  (E->CompressedChunkAddresses).BitPtr = (E->CompressedChunkAddresses).Stream.Data;
  (E->CompressedChunkAddresses).BitPos = 0;
  (E->CompressedChunkAddresses).BitBuf = 0;
  (*paVar1->_vptr_allocator[1])(paVar1,&E->ChunkStream);
  paVar1 = (E->ChunkExpStream).Stream.Alloc;
  (E->ChunkStream).BitPtr = (E->ChunkStream).Stream.Data;
  (E->ChunkStream).BitPos = 0;
  (E->ChunkStream).BitBuf = 0;
  (*paVar1->_vptr_allocator[1])(paVar1,&E->ChunkExpStream);
  paVar1 = (E->LastSigBlock).Alloc;
  (E->ChunkExpStream).BitPtr = (E->ChunkExpStream).Stream.Data;
  (E->ChunkExpStream).BitPos = 0;
  (E->ChunkExpStream).BitBuf = 0;
  (*paVar1->_vptr_allocator[1])(paVar1,&E->LastSigBlock);
  (E->LastSigBlock).Size = 0;
  (E->LastSigBlock).Capacity = 0;
  paVar1 = (E->SubbandExps).Alloc;
  (*paVar1->_vptr_allocator[1])(paVar1,&E->SubbandExps);
  (E->SubbandExps).Size = 0;
  (E->SubbandExps).Capacity = 0;
  return;
}

Assistant:

void
Dealloc(encode_data* E)
{
  E->Alloc->DeallocAll();
  Dealloc(&E->BrickPool);
  idx2_ForEach (ChannelIt, E->Channels)
    Dealloc(ChannelIt.Val);
  Dealloc(&E->Channels);
  idx2_ForEach (SubChannelIt, E->SubChannels)
    Dealloc(SubChannelIt.Val);
  Dealloc(&E->SubChannels);
  Dealloc(&E->SortedChannels);
  Dealloc(&E->SortedSubChannels);
  idx2_ForEach (ChunkMetaIt, E->ChunkMeta)
    Dealloc(ChunkMetaIt.Val);
  idx2_ForEach (ChunkExpIt, E->ChunkExponents)
    Dealloc(ChunkExpIt.Val);
  Dealloc(&E->ChunkMeta);
  //Dealloc(&E->CompressedExps);
  Dealloc(&E->CompressedChunkAddresses);
  Dealloc(&E->ChunkStream);
  Dealloc(&E->ChunkExpStream);
  Dealloc(&E->LastSigBlock);
  Dealloc(&E->SubbandExps);
  //Dealloc(&E->BlockStream);
}